

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_Action.cpp
# Opt level: O2

bool __thiscall
SRUP_MSG_SYNDICATED_ACTION::DeSerialize(SRUP_MSG_SYNDICATED_ACTION *this,uchar *serial_data)

{
  uint64_t *puVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  long lVar4;
  uint8_t (*pauVar5) [8];
  uint8_t *puVar6;
  uchar *puVar7;
  ulong __n;
  uint8_t bytes [2];
  uint8_t tgt_bytes [8];
  uint8_t snd_bytes [8];
  uint8_t sid_bytes [8];
  
  *(this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_version = *serial_data;
  *(this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_msgtype = serial_data[1];
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    sid_bytes[lVar4] = serial_data[lVar4 + 2];
  }
  puVar1 = (this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_sequence_ID;
  if (puVar1 != (uint64_t *)0x0) {
    operator_delete(puVar1);
  }
  pauVar5 = (uint8_t (*) [8])operator_new(8);
  (this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_sequence_ID = (uint64_t *)pauVar5;
  *pauVar5 = sid_bytes;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    snd_bytes[lVar4] = serial_data[lVar4 + 10];
  }
  operator_delete((this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_sender_ID);
  pauVar5 = (uint8_t (*) [8])operator_new(8);
  (this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_sender_ID = (uint64_t *)pauVar5;
  *pauVar5 = snd_bytes;
  bytes = *(uint8_t (*) [2])(serial_data + 0x12);
  uVar2 = SRUP_MSG::decodeLength(bytes);
  puVar6 = (this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_token;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  puVar6 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  (this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_token = puVar6;
  memcpy(puVar6,serial_data + 0x14,(ulong)uVar2);
  (this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_token_len = uVar2;
  bytes = *(uint8_t (*) [2])(serial_data + (ulong)uVar2 + 0x14);
  uVar3 = SRUP_MSG::decodeLength(bytes);
  (this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_sig_len = uVar3;
  puVar6 = (this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_signature;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  __n = (ulong)uVar3;
  puVar6 = (uint8_t *)operator_new__(__n);
  (this->super_SRUP_MSG_ACTION).super_SRUP_MSG.m_signature = puVar6;
  memcpy(puVar6,serial_data + (uVar2 + 0x16),__n);
  puVar6 = (this->super_SRUP_MSG_ACTION).m_action;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  puVar7 = (uchar *)operator_new__(1);
  (this->super_SRUP_MSG_ACTION).m_action = puVar7;
  *puVar7 = serial_data[(uVar2 + 0x16) + __n];
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    tgt_bytes[lVar4] = (serial_data + (uVar2 + 0x16) + __n)[lVar4 + 1];
  }
  operator_delete(this->m_target_ID);
  pauVar5 = (uint8_t (*) [8])operator_new(8);
  this->m_target_ID = (uint64_t *)pauVar5;
  *pauVar5 = tgt_bytes;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_ACTION::DeSerialize(const unsigned char* serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Next we have to unmarshall the sender ID...
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the sender ID
    delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now we have two-bytes for the size of the token ... and x bytes for the token
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_token;
    m_token = new uint8_t[x+1];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    delete[] m_signature;
    m_signature = new uint8_t[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // Now we have one byte for the action ID.
    delete[] m_action;
    m_action = new uint8_t[1];
    std::memcpy(m_action, serial_data + p, 1);
    p+=1;

    // Finally we unmarshall the target ID...
    uint8_t tgt_bytes[8];
    for (unsigned char & tgt_byte : tgt_bytes)
    {
        std::memcpy(&tgt_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the target ID
    delete(m_target_ID);
    m_target_ID = new uint64_t;
    std::memcpy(m_target_ID, tgt_bytes, 8);

    return true;
}